

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kratos_expr.cc
# Opt level: O0

void init_enum_type(module *m)

{
  class_<kratos::Enum,std::shared_ptr<kratos::Enum>> *pcVar1;
  type local_2e;
  type local_2d [13];
  PyObject *local_20;
  class_<kratos::Enum,_std::shared_ptr<kratos::Enum>_> local_18;
  class_<kratos::Enum,_std::shared_ptr<kratos::Enum>_> enum_;
  module *m_local;
  
  local_20 = (m->super_object).super_handle.m_ptr;
  enum_.super_generic_type.super_object.super_handle.m_ptr = (generic_type)(generic_type)m;
  pybind11::class_<kratos::Enum,_std::shared_ptr<kratos::Enum>_>::class_<>
            (&local_18,(handle)local_20,"Enum");
  pcVar1 = (class_<kratos::Enum,std::shared_ptr<kratos::Enum>> *)
           pybind11::class_<kratos::Enum,std::shared_ptr<kratos::Enum>>::
           def_readonly<kratos::Enum,std::__cxx11::string>
                     ((class_<kratos::Enum,std::shared_ptr<kratos::Enum>> *)&local_18,"name",0x40);
  pcVar1 = (class_<kratos::Enum,std::shared_ptr<kratos::Enum>> *)
           pybind11::class_<kratos::Enum,std::shared_ptr<kratos::Enum>>::
           def<init_enum_type(pybind11::module_&)::__0>(pcVar1,"__getitem__",local_2d);
  pcVar1 = (class_<kratos::Enum,std::shared_ptr<kratos::Enum>> *)
           pybind11::class_<kratos::Enum,std::shared_ptr<kratos::Enum>>::
           def<init_enum_type(pybind11::module_&)::__1>(pcVar1,"__getattr__",&local_2e);
  pybind11::class_<kratos::Enum,std::shared_ptr<kratos::Enum>>::def_readwrite<kratos::Enum,bool>
            (pcVar1,"external",0x60);
  pybind11::class_<kratos::Enum,_std::shared_ptr<kratos::Enum>_>::~class_(&local_18);
  return;
}

Assistant:

void init_enum_type(py::module &m) {
    using namespace kratos;
    auto enum_ = py::class_<Enum, std::shared_ptr<Enum>>(m, "Enum");
    enum_.def_readonly("name", &Enum::name)
        .def("__getitem__",
             [](Enum &enum_, const std::string &name) { return enum_.get_enum(name); })
        .def("__getattr__",
             [](Enum &enum_, const std::string &name) { return enum_.get_enum(name); })
        .def_readwrite("external", &Enum::external);
}